

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAxis2Placement3D::IfcAxis2Placement3D(IfcAxis2Placement3D *this)

{
  *(undefined ***)&this->field_0x68 = &PTR__Object_007fca00;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcAxis2Placement3D";
  IfcPlacement::IfcPlacement(&this->super_IfcPlacement,&PTR_construction_vtable_24__00820590);
  *(undefined8 *)&(this->super_IfcPlacement).field_0x40 = 0;
  *(undefined8 *)&(this->super_IfcPlacement).field_0x48 = 0;
  (this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8204d8;
  *(undefined8 *)&this->field_0x68 = 0x820578;
  *(undefined8 *)
   &(this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x820500;
  *(undefined8 *)
   &(this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x820528;
  *(undefined8 *)&(this->super_IfcPlacement).field_0x38 = 0x820550;
  this->field_0x50 = 0;
  (this->RefDirection).ptr.obj = (LazyObject *)0x0;
  (this->RefDirection).have = false;
  return;
}

Assistant:

IfcAxis2Placement3D() : Object("IfcAxis2Placement3D") {}